

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_block_graph.cpp
# Opt level: O2

string * __thiscall
IRT::getBlockLabel_abi_cxx11_(string *__return_storage_ptr__,IRT *this,CStatementList *basicBlock)

{
  __uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> _Var1;
  uint __line;
  vector<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
  *pvVar2;
  CLabelStatement *this_00;
  char *__assertion;
  CLabel local_30;
  
  if (this == (IRT *)0x0) {
    __assertion = "basicBlock != nullptr";
    __line = 0x40;
  }
  else {
    pvVar2 = CStatementList::Statements((CStatementList *)this);
    if ((pvVar2->
        super__Vector_base<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish ==
        (pvVar2->
        super__Vector_base<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start) {
      __assertion = "basicBlock->Statements().size() != 0";
      __line = 0x41;
    }
    else {
      pvVar2 = CStatementList::Statements((CStatementList *)this);
      _Var1._M_t.
      super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>.
      super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl =
           (((pvVar2->
             super__Vector_base<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start)->_M_t).
           super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
           ._M_t;
      if ((_Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>)
          _Var1._M_t.
          super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>
          .super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl != (CStatement *)0x0)
      {
        this_00 = (CLabelStatement *)
                  __dynamic_cast(_Var1._M_t.
                                 super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>
                                 .super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl
                                 ,&CStatement::typeinfo,&CLabelStatement::typeinfo,0);
        if (this_00 != (CLabelStatement *)0x0) {
          CLabelStatement::Label(&local_30,this_00);
          CLabel::ToString_abi_cxx11_(__return_storage_ptr__,&local_30);
          std::__cxx11::string::~string((string *)&local_30);
          return __return_storage_ptr__;
        }
      }
      __assertion = "label != nullptr";
      __line = 0x44;
    }
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/IRT/basic_blocks/basic_block_graph.cpp"
                ,__line,"std::string IRT::getBlockLabel(const CStatementList *)");
}

Assistant:

std::string getBlockLabel(const CStatementList *basicBlock) {
        assert(basicBlock != nullptr);
        assert(basicBlock->Statements().size() != 0);
        const CStatement* firstStm = basicBlock->Statements().front().get();
        const CLabelStatement* label = dynamic_cast<const CLabelStatement*>(firstStm);
        assert(label != nullptr);

        return label->Label().ToString();
    }